

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

void __thiscall TC_parser<true>::listNameSpace(TC_parser<true> *this)

{
  char *pos;
  
  while( true ) {
    pos = this->reading_head;
    if ((*pos != '|') || (this->endLine <= pos)) break;
    this->reading_head = pos + 1;
    nameSpace(this);
  }
  if (*pos == '\r' || pos == this->endLine) {
    return;
  }
  parserWarning(this,"malformed example! \'|\' or EOL expected after : \"",this->beginLine,pos,"\"")
  ;
  return;
}

Assistant:

inline void listNameSpace()
  {
    while ((*reading_head == '|') && (reading_head < endLine))  // ListNameSpace --> '|' NameSpace ListNameSpace
    {
      ++reading_head;
      nameSpace();
    }
    if (reading_head != endLine && *reading_head != '\r')
    {
      // syntax error
      parserWarning("malformed example! '|' or EOL expected after : \"", beginLine, reading_head, "\"");
    }
  }